

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen_helpers.hpp
# Opt level: O3

bool ear::doIntersect<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>>
               (_Rb_tree_const_iterator<int> first1,_Rb_tree_const_iterator<int> last1,
               _Rb_tree_const_iterator<int> first2,_Rb_tree_const_iterator<int> last2)

{
  if (first2._M_node == last2._M_node || first1._M_node == last1._M_node) {
    return false;
  }
  while( true ) {
    if ((int)first1._M_node[1]._M_color < (int)first2._M_node[1]._M_color) {
      first1._M_node = (_Base_ptr)std::_Rb_tree_increment(first1._M_node);
    }
    else {
      if ((int)first1._M_node[1]._M_color <= (int)first2._M_node[1]._M_color) {
        return true;
      }
      first2._M_node = (_Base_ptr)std::_Rb_tree_increment(first2._M_node);
    }
    if (first1._M_node == last1._M_node) break;
    if (first2._M_node == last2._M_node) {
      return false;
    }
  }
  return false;
}

Assistant:

bool doIntersect(InputIterator1 first1, InputIterator1 last1,
                   InputIterator2 first2, InputIterator2 last2) {
    while (first1 != last1 && first2 != last2) {
      if (*first1 < *first2)
        ++first1;
      else if (*first2 < *first1)
        ++first2;
      else {
        return true;
      }
    }
    return false;
  }